

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

void setpath(lua_State *L,char *fieldname,char *envname1,char *envname2,char *def)

{
  int iVar1;
  char *s;
  char *local_38;
  char *path;
  char *def_local;
  char *envname2_local;
  char *envname1_local;
  char *fieldname_local;
  lua_State *L_local;
  
  local_38 = getenv(envname1);
  if (local_38 == (char *)0x0) {
    local_38 = getenv(envname2);
  }
  if (local_38 != (char *)0x0) {
    iVar1 = noenv(L);
    if (iVar1 == 0) {
      s = luaL_gsub(L,local_38,";;",";\x01;");
      luaL_gsub(L,s,"\x01",def);
      lua_remove(L,-2);
      goto LAB_0012b456;
    }
  }
  lua_pushstring(L,def);
LAB_0012b456:
  lua_setfield(L,-2,fieldname);
  return;
}

Assistant:

static void setpath (lua_State *L, const char *fieldname, const char *envname1,
                                   const char *envname2, const char *def) {
  const char *path = getenv(envname1);
  if (path == NULL)  /* no environment variable? */
    path = getenv(envname2);  /* try alternative name */
  if (path == NULL || noenv(L))  /* no environment variable? */
    lua_pushstring(L, def);  /* use default */
  else {
    /* replace ";;" by ";AUXMARK;" and then AUXMARK by default path */
    path = luaL_gsub(L, path, LUA_PATH_SEP LUA_PATH_SEP,
                              LUA_PATH_SEP AUXMARK LUA_PATH_SEP);
    luaL_gsub(L, path, AUXMARK, def);
    lua_remove(L, -2);
  }
  setprogdir(L);
  lua_setfield(L, -2, fieldname);
}